

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::
Stack<std::unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>_>
::expand(Stack<std::unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>_>
         *this)

{
  UnificationConstraintStack *pUVar1;
  UnificationConstraintStack *pUVar2;
  unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  *in_RDI;
  size_t i;
  unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  *newStack;
  void *mem;
  size_t newCapacity;
  UnificationConstraintStack *pUVar3;
  UnificationConstraintStack *local_28;
  
  if ((in_RDI->_M_t).
      super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
      ._M_t.
      super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
      .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl ==
      (UnificationConstraintStack *)0x0) {
    pUVar1 = (UnificationConstraintStack *)0x8;
  }
  else {
    pUVar1 = (UnificationConstraintStack *)
             ((long)(in_RDI->_M_t).
                    super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
                    .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl
             << 1);
  }
  pUVar3 = pUVar1;
  pUVar2 = (UnificationConstraintStack *)Lib::alloc((size_t)in_RDI);
  if ((in_RDI->_M_t).
      super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
      ._M_t.
      super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
      .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl !=
      (UnificationConstraintStack *)0x0) {
    for (local_28 = (UnificationConstraintStack *)0x0;
        local_28 <
        (in_RDI->_M_t).
        super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
        ._M_t.
        super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
        .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl;
        local_28 = (UnificationConstraintStack *)((long)&(local_28->_cont)._capacity + 1)) {
      std::
      unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
      ::unique_ptr(in_RDI,(unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
                           *)pUVar3);
      std::
      unique_ptr<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
      ::~unique_ptr(in_RDI);
    }
    Lib::free(in_RDI[1]._M_t.
              super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
              ._M_t.
              super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
              .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl);
  }
  in_RDI[1]._M_t.
  super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  ._M_t.
  super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
  .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl = pUVar2;
  in_RDI[2]._M_t.
  super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  ._M_t.
  super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
  .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl =
       (UnificationConstraintStack *)
       ((long)&((in_RDI[1]._M_t.
                 super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
                 .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl)->
               _cont)._capacity +
       (long)(in_RDI->_M_t).
             super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
             .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl * 8);
  in_RDI[3]._M_t.
  super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  ._M_t.
  super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
  .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl =
       (UnificationConstraintStack *)
       ((long)&((in_RDI[1]._M_t.
                 super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
                 .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl)->
               _cont)._capacity + (long)pUVar1 * 8);
  (in_RDI->_M_t).
  super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  ._M_t.
  super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
  .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl = pUVar1;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }